

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O1

string * __thiscall TypeInfo::get_summary_abi_cxx11_(string *__return_storage_ptr__,TypeInfo *this)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  _Hash_node_base *p_Var5;
  int iVar6;
  int iVar7;
  char buffer [1024];
  char local_418 [1032];
  
  p_Var5 = (this->m_symbols)._M_h._M_before_begin._M_nxt;
  iVar1 = 0;
  iVar3 = 0;
  iVar4 = 0;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    iVar4 = 0;
    iVar3 = 0;
    do {
      iVar4 = iVar4 + 1;
      iVar3 = iVar3 + (uint)*(byte *)&p_Var5[0x10]._M_nxt;
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  p_Var5 = (this->m_types)._M_h._M_before_begin._M_nxt;
  iVar7 = 0;
  iVar6 = 0;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    iVar6 = 0;
    iVar7 = 0;
    iVar1 = 0;
    do {
      iVar6 = iVar6 + 1;
      iVar7 = iVar7 + (uint)*(byte *)&p_Var5[9]._M_nxt;
      iVar1 = iVar1 + (uint)*(byte *)((long)&p_Var5[9]._M_nxt + 1);
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  sprintf(local_418,
          "TypeInfo Summary\n Total Symbols: %d\n   with type info: %d (%.2f%%)\n Total Types: %d\n   with info: %d (%.2f%%)\n   with method count: %d (%.2f%%)\n"
          ,(double)(((float)iVar3 * 100.0) / (float)iVar4),
          (double)(((float)iVar7 * 100.0) / (float)iVar6),
          (double)(((float)iVar1 * 100.0) / (float)iVar6));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(local_418);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_418,local_418 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeInfo::get_summary() {
  int total_symbols = 0;
  int syms_with_type_info = 0;
  for (const auto& kv : m_symbols) {
    total_symbols++;
    if (kv.second.has_type_info()) {
      syms_with_type_info++;
    }
  }

  int total_types = 0;
  int types_with_info = 0;
  int types_with_method_count = 0;
  for (const auto& kv : m_types) {
    total_types++;
    if (kv.second.has_info()) {
      types_with_info++;
    }
    if (kv.second.has_method_count()) {
      types_with_method_count++;
    }
  }

  char buffer[1024];
  sprintf(buffer,
          "TypeInfo Summary\n"
          " Total Symbols: %d\n"
          "   with type info: %d (%.2f%%)\n"
          " Total Types: %d\n"
          "   with info: %d (%.2f%%)\n"
          "   with method count: %d (%.2f%%)\n",
          total_symbols, syms_with_type_info, 100.f * float(syms_with_type_info) / float(total_symbols),
          total_types, types_with_info, 100.f * float(types_with_info) / float(total_types),
          types_with_method_count, 100.f * float(types_with_method_count) / float(total_types));

  return {buffer};
}